

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

size_t obu_memmove(size_t obu_header_size,size_t obu_payload_size,uint8_t *data,size_t data_size)

{
  size_t sVar1;
  
  sVar1 = aom_uleb_size_in_bytes(obu_payload_size);
  if ((data_size < obu_payload_size) ||
     (data_size - obu_payload_size < sVar1 + obu_header_size ||
      data_size - obu_payload_size < obu_header_size)) {
    sVar1 = 0;
  }
  else {
    memmove(data + sVar1 + obu_header_size,data + obu_header_size,obu_payload_size);
  }
  return sVar1;
}

Assistant:

static size_t obu_memmove(size_t obu_header_size, size_t obu_payload_size,
                          uint8_t *data, size_t data_size) {
  const size_t length_field_size = aom_uleb_size_in_bytes(obu_payload_size);
  const size_t move_dst_offset = obu_header_size + length_field_size;
  const size_t move_src_offset = obu_header_size;
  const size_t move_size = obu_payload_size;
  if (move_size > data_size || move_src_offset > data_size - move_size) {
    assert(0 && "obu_memmove: output buffer overflow");
    return 0;
  }
  if (move_dst_offset > data_size - move_size) {
    // Buffer full.
    return 0;
  }
  memmove(data + move_dst_offset, data + move_src_offset, move_size);
  return length_field_size;
}